

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinyexr.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong *puVar2;
  char *pcVar3;
  uint uVar4;
  uint extraout_EAX;
  ulong uVar5;
  ulong in_RCX;
  undefined8 *extraout_RDX;
  char **unaff_RBX;
  char *pcVar6;
  long *plVar7;
  undefined8 *in_R8;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong *puVar12;
  long lVar13;
  char *err;
  int height;
  int width;
  float *image;
  char *apcStackY_98 [2];
  char acStackY_88 [16];
  char **ppcStackY_78;
  char *local_38;
  int local_30;
  int local_2c;
  float *local_28 [3];
  
  local_38 = (char *)0x0;
  if (argc < 2) {
    main_cold_2();
    uVar4 = extraout_EAX;
  }
  else {
    unaff_RBX = (char **)argv[1];
    argv = unaff_RBX;
    uVar4 = ParseEXRVersionFromFile((EXRVersion *)local_28,(char *)unaff_RBX);
    if (uVar4 == 0) {
      uVar4 = LoadEXRWithLayer(local_28,&local_2c,&local_30,(char *)unaff_RBX,(char *)0x0,&local_38)
      ;
      if (uVar4 == 0) {
        uVar4 = SaveEXR(local_28[0],local_2c,local_30,4,1,"output.exr",&local_38);
        if (uVar4 != 0) {
          if (local_38 == (char *)0x0) {
            fprintf(_stderr,"Failed to save EXR image. code = %d\n",(ulong)uVar4);
          }
          else {
            fprintf(_stderr,"Save EXR err: %s(code %d)\n",local_38,(ulong)uVar4);
          }
        }
        free(local_28[0]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Wrote output.exr.",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        if (local_38 == (char *)0x0) {
          fprintf(_stderr,"Load EXR err: code = %d\n",(ulong)uVar4);
        }
        else {
          fprintf(_stderr,"Load EXR err: %s(code %d)\n",local_38,(ulong)uVar4);
        }
        if (local_38 != (char *)0x0) {
          free(local_38);
        }
      }
      return uVar4;
    }
  }
  plVar7 = (long *)(ulong)uVar4;
  main_cold_1();
  lVar9 = *plVar7;
  lVar11 = plVar7[1];
  if (lVar11 == lVar9) {
    return 0;
  }
  uVar5 = 0;
  do {
    lVar13 = *(long *)(lVar9 + uVar5 * 0x18);
    if (*(long *)(lVar9 + 8 + uVar5 * 0x18) != lVar13) {
      uVar10 = 0;
      do {
        if (*(long *)(lVar13 + 8 + uVar10 * 0x18) != *(long *)(lVar13 + uVar10 * 0x18)) {
          uVar4 = 1;
          uVar8 = 0;
          puVar2 = (ulong *)*extraout_RDX;
          do {
            puVar12 = puVar2 + 1;
            if ((ulong *)((long)argv + in_RCX) <= puVar12) {
              pcVar6 = "Insufficient data size in offset table.";
              pcVar3 = "Insufficient data size in offset table.";
LAB_0010dc12:
              apcStackY_98[0] = acStackY_88;
              ppcStackY_78 = unaff_RBX;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)apcStackY_98,pcVar6,pcVar3 + 0x27);
              pcVar3 = apcStackY_98[0];
              if (in_R8 != (undefined8 *)0x0) {
                pcVar6 = strdup(apcStackY_98[0]);
                *in_R8 = pcVar6;
              }
              if (pcVar3 != acStackY_88) {
                operator_delete(pcVar3);
              }
              return -4;
            }
            uVar1 = *puVar2;
            if (in_RCX <= uVar1) {
              pcVar6 = "Invalid offset value in DecodeEXRImage.";
              pcVar3 = "Invalid offset value in DecodeEXRImage.";
              goto LAB_0010dc12;
            }
            *extraout_RDX = puVar12;
            lVar9 = *plVar7;
            lVar13 = *(long *)(lVar9 + uVar5 * 0x18);
            lVar11 = *(long *)(lVar13 + uVar10 * 0x18);
            *(ulong *)(lVar11 + uVar8 * 8) = uVar1;
            uVar8 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
            puVar2 = puVar12;
          } while (uVar8 < (ulong)(*(long *)(lVar13 + 8 + uVar10 * 0x18) - lVar11 >> 3));
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        uVar8 = (*(long *)(lVar9 + 8 + uVar5 * 0x18) - lVar13 >> 3) * -0x5555555555555555;
      } while (uVar10 <= uVar8 && uVar8 - uVar10 != 0);
      lVar11 = plVar7[1];
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    uVar10 = (lVar11 - lVar9 >> 3) * -0x5555555555555555;
    if (uVar10 < uVar5 || uVar10 - uVar5 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int test_main(int argc, char** argv) {
  const char* outfilename = "output_test.exr";
  const char* err = NULL;

  if (argc < 2) {
    fprintf(stderr, "Needs input.exr.\n");
    exit(-1);
  }

  if (argc > 2) {
    outfilename = argv[2];
  }

  const char* input_filename = argv[1];

#ifdef SIMPLE_API_EXAMPLE
  (void)outfilename;
  int width, height;
  float* image;

  int ret = IsEXR(input_filename);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "File not found or given file is not a EXR format. code %d\n", ret);
    exit(-1);
  }

  ret = LoadEXR(&image, &width, &height, input_filename, &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Load EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Load EXR err: code = %d\n", ret);
    }
    FreeEXRErrorMessage(err);
    return ret;
  }

  // SaveAsPFM("output.pfm", width, height, image);
  ret = SaveEXR(image, width, height, 4 /* =RGBA*/,
                1 /* = save as fp16 format */, "output.exr", &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Save EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Failed to save EXR image. code = %d\n", ret);
    }
  }
  free(image);

  std::cout << "Wrote output.exr." << std::endl;
#else

  EXRVersion exr_version;

  int ret = ParseEXRVersionFromFile(&exr_version, input_filename);
  if (ret != 0) {
    fprintf(stderr, "Invalid EXR file: %s\n", input_filename);
    return -1;
  }

  printf(
      "version: tiled = %d, long_name = %d, non_image = %d, multipart = %d\n",
      exr_version.tiled, exr_version.long_name, exr_version.non_image,
      exr_version.multipart);

  if (exr_version.multipart) {
    EXRHeader** exr_headers;  // list of EXRHeader pointers.
    int num_exr_headers;

    ret = ParseEXRMultipartHeaderFromFile(&exr_headers, &num_exr_headers,
                                          &exr_version, argv[1], &err);
    if (ret != 0) {
      fprintf(stderr, "Parse EXR err: %s\n", err);
      return ret;
    }

    printf("num parts = %d\n", num_exr_headers);

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      const EXRHeader& exr_header = *(exr_headers[i]);

      printf("Part: %lu\n", static_cast<unsigned long>(i));

      printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
             exr_header.data_window.min_y, exr_header.data_window.max_x,
             exr_header.data_window.max_y);
      printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
             exr_header.display_window.min_y, exr_header.display_window.max_x,
             exr_header.display_window.max_y);
      printf("screenWindowCenter = %f, %f\n",
             static_cast<double>(exr_header.screen_window_center[0]),
             static_cast<double>(exr_header.screen_window_center[1]));
      printf("screenWindowWidth = %f\n",
             static_cast<double>(exr_header.screen_window_width));
      printf("pixelAspectRatio = %f\n",
             static_cast<double>(exr_header.pixel_aspect_ratio));
      printf("lineOrder = %d\n", exr_header.line_order);

      if (exr_header.num_custom_attributes > 0) {
        printf("# of custom attributes = %d\n",
               exr_header.num_custom_attributes);
        for (int a = 0; a < exr_header.num_custom_attributes; a++) {
          printf("  [%d] name = %s, type = %s, size = %d\n", a,
                 exr_header.custom_attributes[a].name,
                 exr_header.custom_attributes[a].type,
                 exr_header.custom_attributes[a].size);
          // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
          //  printf("    value = %f\n", *reinterpret_cast<float
          //  *>(exr_header.custom_attributes[i].value));
          //}
        }
      }
    }

    std::vector<EXRImage> images(static_cast<size_t>(num_exr_headers));
    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      InitEXRImage(&images[i]);
    }

    ret = LoadEXRMultipartImageFromFile(
        &images.at(0), const_cast<const EXRHeader**>(exr_headers),
        static_cast<unsigned int>(num_exr_headers), input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("Loaded %d part images\n", num_exr_headers);
    printf(
        "There is no saving feature for multi-part images, thus just exit an "
        "application...\n");

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRImage(&images.at(i));
    }

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRHeader(exr_headers[i]);
      free(exr_headers[i]);
    }
    free(exr_headers);

  } else {  // single-part EXR

    EXRHeader exr_header;
    InitEXRHeader(&exr_header);

    ret =
        ParseEXRHeaderFromFile(&exr_header, &exr_version, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Parse single-part EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
           exr_header.data_window.min_y, exr_header.data_window.max_x,
           exr_header.data_window.max_y);
    printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
           exr_header.display_window.min_y, exr_header.display_window.max_x,
           exr_header.display_window.max_y);
    printf("screenWindowCenter = %f, %f\n",
           static_cast<double>(exr_header.screen_window_center[0]),
           static_cast<double>(exr_header.screen_window_center[1]));
    printf("screenWindowWidth = %f\n",
           static_cast<double>(exr_header.screen_window_width));
    printf("pixelAspectRatio = %f\n",
           static_cast<double>(exr_header.pixel_aspect_ratio));
    printf("lineOrder = %d\n", exr_header.line_order);

    if (exr_header.num_custom_attributes > 0) {
      printf("# of custom attributes = %d\n", exr_header.num_custom_attributes);
      for (int i = 0; i < exr_header.num_custom_attributes; i++) {
        printf("  [%d] name = %s, type = %s, size = %d\n", i,
               exr_header.custom_attributes[i].name,
               exr_header.custom_attributes[i].type,
               exr_header.custom_attributes[i].size);
        // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
        //  printf("    value = %f\n", *reinterpret_cast<float
        //  *>(exr_header.custom_attributes[i].value));
        //}
      }
    }

    // Read HALF channel as FLOAT.
    for (int i = 0; i < exr_header.num_channels; i++) {
      if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
        exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
      }
    }

    EXRImage exr_image;
    InitEXRImage(&exr_image);

    ret = LoadEXRImageFromFile(&exr_image, &exr_header, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("EXR: %d x %d\n", exr_image.width, exr_image.height);

    for (int i = 0; i < exr_header.num_channels; i++) {
      printf("pixelType[%d]: %s\n", i, GetPixelType(exr_header.pixel_types[i]));
      printf("chan[%d] = %s\n", i, exr_header.channels[i].name);
      printf("requestedPixelType[%d]: %s\n", i,
             GetPixelType(exr_header.requested_pixel_types[i]));
    }

#if 0  // example to write custom attribute
    int version_minor = 3;
    exr_header.num_custom_attributes = 1;
    exr_header.custom_attributes = reinterpret_cast<EXRAttribute *>(malloc(sizeof(EXRAttribute) * exr_header.custom_attributes));
    strcpy(exr_header.custom_attributes[0].name, "tinyexr_version_minor");
    exr_header.custom_attributes[0].name[strlen("tinyexr_version_minor")] = '\0';
    strcpy(exr_header.custom_attributes[0].type, "int");
    exr_header.custom_attributes[0].type[strlen("int")] = '\0';
    exr_header.custom_attributes[0].size = sizeof(int);
    exr_header.custom_attributes[0].value = (unsigned char*)malloc(sizeof(int));
    memcpy(exr_header.custom_attributes[0].value, &version_minor, sizeof(int));
#endif

    if (exr_header.tiled) {
      TiledImageToScanlineImage(&exr_image, &exr_header);
    }

    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

#ifdef TEST_ZFP_COMPRESSION
    // Assume input image is FLOAT pixel type.
    for (int i = 0; i < exr_header.num_channels; i++) {
      exr_header.channels[i].pixel_type = TINYEXR_PIXELTYPE_FLOAT;
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }

    unsigned char zfp_compression_type = TINYEXR_ZFP_COMPRESSIONTYPE_RATE;
    double zfp_compression_rate = 4;
    exr_header.num_custom_attributes = 2;
    strcpy(exr_header.custom_attributes[0].name, "zfpCompressionType");
    exr_header.custom_attributes[0].name[strlen("zfpCompressionType")] = '\0';
    exr_header.custom_attributes[0].size = 1;
    exr_header.custom_attributes[0].value =
        (unsigned char*)malloc(sizeof(unsigned char));
    exr_header.custom_attributes[0].value[0] = zfp_compression_type;

    strcpy(exr_header.custom_attributes[1].name, "zfpCompressionRate");
    exr_header.custom_attributes[1].name[strlen("zfpCompressionRate")] = '\0';
    exr_header.custom_attributes[1].size = sizeof(double);
    exr_header.custom_attributes[1].value =
        (unsigned char*)malloc(sizeof(double));
    memcpy(exr_header.custom_attributes[1].value, &zfp_compression_rate,
           sizeof(double));
    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_ZFP;
#endif

    ret = SaveEXRImageToFile(&exr_image, &exr_header, outfilename, &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }
    printf("Saved exr file. [ %s ] \n", outfilename);

    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
  }
#endif

  return ret;
}